

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::CornerCoordinates
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,
          TPZFMatrix<double> *coord)

{
  TPZGeoNode *pTVar1;
  int j;
  long lVar2;
  
  pTVar1 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(((this->super_TPZGeoEl).fMesh)->fNodeVec).
                       super_TPZChunkVector<TPZGeoNode,_10>,
                      (this->fGeo).super_TPZGeoPoint.super_TPZNodeRep<1,_pztopology::TPZPoint>.
                      fNodeIndexes[0]);
  lVar2 = 0;
  while ((lVar2 < (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow &&
         (0 < (coord->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol))) {
    coord->fElem[lVar2] = pTVar1->fCoord[lVar2];
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      return;
    }
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

inline void TPZGeoElRefLess<TGeo>::CornerCoordinates(TPZFMatrix<REAL> &coord) const
{
    for(int i=0;i<TGeo::NNodes;i++) {
        auto &np = fMesh->NodeVec()[fGeo.fNodeIndexes[i]];
        for(int j=0;j<3;j++) {
            coord(j,i) = np.Coord(j);
        }
    }
}